

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::tonk_status_ex(Connection *this,TonkStatusEx *statusEx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint16_t uVar8;
  ReceiverStatistics RVar9;
  Locker locker;
  Locker local_20;
  
  local_20.TheLock = &this->PublicAPILock;
  statusEx->ConnectionKey = this->EncryptionKey;
  std::recursive_mutex::lock(&(local_20.TheLock)->cs);
  uVar1 = *(undefined8 *)(this->CachedLocalAddress).NetworkString;
  uVar2 = *(undefined8 *)((this->CachedLocalAddress).NetworkString + 8);
  uVar3 = *(undefined8 *)((this->CachedLocalAddress).NetworkString + 0x10);
  uVar4 = *(undefined8 *)((this->CachedLocalAddress).NetworkString + 0x18);
  uVar5 = *(undefined8 *)((this->CachedLocalAddress).NetworkString + 0x12);
  uVar6 = *(undefined8 *)((this->CachedLocalAddress).NetworkString + 0x1a);
  uVar7 = *(undefined8 *)((this->CachedLocalAddress).NetworkString + 0x22);
  *(undefined8 *)((statusEx->Local).NetworkString + 10) =
       *(undefined8 *)((this->CachedLocalAddress).NetworkString + 10);
  *(undefined8 *)((statusEx->Local).NetworkString + 0x12) = uVar5;
  *(undefined8 *)((statusEx->Local).NetworkString + 0x1a) = uVar6;
  *(undefined8 *)((statusEx->Local).NetworkString + 0x22) = uVar7;
  *(undefined8 *)(statusEx->Local).NetworkString = uVar1;
  *(undefined8 *)((statusEx->Local).NetworkString + 8) = uVar2;
  *(undefined8 *)((statusEx->Local).NetworkString + 0x10) = uVar3;
  *(undefined8 *)((statusEx->Local).NetworkString + 0x18) = uVar4;
  statusEx->RemoteAssignedIdForLocalHost = this->RemoteAssignedIdForLocalHost;
  statusEx->PeerSeenLossRate = (this->CachedReceiverStats).LossRate;
  statusEx->PeerSeenBPS = (this->CachedReceiverStats).GoodputBPS;
  statusEx->PeerTripUsec = (this->CachedReceiverStats).TripUsec;
  uVar8 = this->RemoteNATMapExternalPort;
  statusEx->LocalNATMapExternalPort = this->LocalNATMapExternalPort;
  statusEx->RemoteNATMapExternalPort = uVar8;
  Locker::~Locker(&local_20);
  SessionOutgoing::tonk_status_ex(&this->Outgoing,statusEx);
  RVar9 = ReceiverBandwidthControl::GetStatistics(&this->ReceiverControl);
  statusEx->IncomingBPS = RVar9.GoodputBPS;
  statusEx->IncomingLossRate = RVar9.LossRate;
  statusEx->TripUsec = RVar9.TripUsec;
  return;
}

Assistant:

void Connection::tonk_status_ex(TonkStatusEx& statusEx)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    statusEx.ConnectionKey = EncryptionKey; // Set during Initialize() - safe

    //--------------------------------------------------------------------------
    // API Lock
    {
        Locker locker(PublicAPILock);

        // Fill in local address
        statusEx.Local = CachedLocalAddress;
        statusEx.RemoteAssignedIdForLocalHost = RemoteAssignedIdForLocalHost;

        // Fill in peer receiver stats from the last TimeSync message
        statusEx.PeerSeenLossRate = CachedReceiverStats.LossRate;
        statusEx.PeerSeenBPS = CachedReceiverStats.GoodputBPS;
        statusEx.PeerTripUsec = CachedReceiverStats.TripUsec;

        // Fill in NAT map state
        statusEx.RemoteNATMapExternalPort = RemoteNATMapExternalPort;
        statusEx.LocalNATMapExternalPort = LocalNATMapExternalPort;
    }
    //--------------------------------------------------------------------------

    Outgoing.tonk_status_ex(statusEx);

    // Fill in local receiver stats
    const ReceiverStatistics receiverStats = ReceiverControl.GetStatistics();
    statusEx.IncomingBPS = receiverStats.GoodputBPS;
    statusEx.IncomingLossRate = receiverStats.LossRate;
    statusEx.TripUsec = receiverStats.TripUsec;
}